

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_dict.c
# Opt level: O0

REF_STATUS ref_dict_create(REF_DICT *ref_dict_ptr)

{
  REF_DICT pRVar1;
  REF_INT *pRVar2;
  REF_DICT ref_dict;
  REF_DICT *ref_dict_ptr_local;
  
  pRVar1 = (REF_DICT)malloc(0x20);
  *ref_dict_ptr = pRVar1;
  if (*ref_dict_ptr == (REF_DICT)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",0x1f,
           "ref_dict_create","malloc *ref_dict_ptr of REF_DICT_STRUCT NULL");
    ref_dict_ptr_local._4_4_ = 2;
  }
  else {
    pRVar1 = *ref_dict_ptr;
    pRVar1->n = 0;
    pRVar1->max = 10;
    if (pRVar1->max < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",0x26,
             "ref_dict_create","malloc ref_dict->key of REF_INT negative");
      ref_dict_ptr_local._4_4_ = 1;
    }
    else {
      pRVar2 = (REF_INT *)malloc((long)pRVar1->max << 2);
      pRVar1->key = pRVar2;
      if (pRVar1->key == (REF_INT *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",0x26
               ,"ref_dict_create","malloc ref_dict->key of REF_INT NULL");
        ref_dict_ptr_local._4_4_ = 2;
      }
      else if (pRVar1->max < 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",0x27
               ,"ref_dict_create","malloc ref_dict->value of REF_INT negative");
        ref_dict_ptr_local._4_4_ = 1;
      }
      else {
        pRVar2 = (REF_INT *)malloc((long)pRVar1->max << 2);
        pRVar1->value = pRVar2;
        if (pRVar1->value == (REF_INT *)0x0) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_dict.c",
                 0x27,"ref_dict_create","malloc ref_dict->value of REF_INT NULL");
          ref_dict_ptr_local._4_4_ = 2;
        }
        else {
          ref_dict_ptr_local._4_4_ = 0;
        }
      }
    }
  }
  return ref_dict_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_dict_create(REF_DICT *ref_dict_ptr) {
  REF_DICT ref_dict;

  ref_malloc(*ref_dict_ptr, 1, REF_DICT_STRUCT);

  ref_dict = (*ref_dict_ptr);

  ref_dict_n(ref_dict) = 0;
  ref_dict_max(ref_dict) = 10;

  ref_malloc(ref_dict->key, ref_dict_max(ref_dict), REF_INT);
  ref_malloc(ref_dict->value, ref_dict_max(ref_dict), REF_INT);

  return REF_SUCCESS;
}